

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA4Application.cpp
# Opt level: O0

void PA4Application::usage(string *shortDescription,string *synopsis,string *description)

{
  string *description_local;
  string *synopsis_local;
  string *shortDescription_local;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (shortDescription,"Application for programming assignment 4");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (synopsis,"pa4");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (description,
             "  An application for texture mapping.\n  The following key bindings are available to interact with thi application:\n     <up> / <down>    increase / decrease latitude angle of the camera position\n     <left> / <right> increase / decrease longitude angle of the camera position\n     R                reset the view\n"
            );
  return;
}

Assistant:

void PA4Application::usage(std::string & shortDescription, std::string & synopsis, std::string & description)
{
  shortDescription = "Application for programming assignment 4";
  synopsis = "pa4";
  description = "  An application for texture mapping.\n"
                "  The following key bindings are available to interact with thi application:\n"
                "     <up> / <down>    increase / decrease latitude angle of the camera position\n"
                "     <left> / <right> increase / decrease longitude angle of the camera position\n"
                "     R                reset the view\n";
}